

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O3

btVector3 __thiscall
btSoftClusterCollisionShape::localGetSupportingVertex
          (btSoftClusterCollisionShape *this,btVector3 *vec)

{
  Node **ppNVar1;
  ulong uVar2;
  ulong uVar3;
  Node *pNVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  ppNVar1 = (this->m_cluster->m_nodes).m_data;
  pNVar4 = *ppNVar1;
  uVar2 = (ulong)(this->m_cluster->m_nodes).m_size;
  if (1 < (long)uVar2) {
    fVar6 = (pNVar4->m_x).m_floats[2] * vec->m_floats[2] +
            (pNVar4->m_x).m_floats[0] * vec->m_floats[0] +
            (pNVar4->m_x).m_floats[1] * vec->m_floats[1];
    uVar3 = 0;
    uVar5 = 1;
    do {
      pNVar4 = ppNVar1[uVar5];
      fVar7 = (pNVar4->m_x).m_floats[2] * vec->m_floats[2] +
              (pNVar4->m_x).m_floats[0] * vec->m_floats[0] +
              (pNVar4->m_x).m_floats[1] * vec->m_floats[1];
      if (fVar6 < fVar7) {
        uVar3 = uVar5 & 0xffffffff;
        fVar6 = fVar7;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    pNVar4 = ppNVar1[(int)uVar3];
  }
  return (btVector3)*&(pNVar4->m_x).m_floats;
}

Assistant:

virtual btVector3	localGetSupportingVertex(const btVector3& vec) const
	{
		btSoftBody::Node* const *						n=&m_cluster->m_nodes[0];
		btScalar										d=btDot(vec,n[0]->m_x);
		int												j=0;
		for(int i=1,ni=m_cluster->m_nodes.size();i<ni;++i)
		{
			const btScalar	k=btDot(vec,n[i]->m_x);
			if(k>d) { d=k;j=i; }
		}
		return(n[j]->m_x);
	}